

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O3

bool __thiscall
CompareTxMemPoolEntryByDescendantScore::operator()
          (CompareTxMemPoolEntryByDescendantScore *this,CTxMemPoolEntry *a,CTxMemPoolEntry *b)

{
  bool bVar1;
  long in_FS_OFFSET;
  double b_size;
  double b_mod_fee;
  double a_size;
  double a_mod_fee;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GetModFeeAndSize(this,a,&local_40,&local_48);
  GetModFeeAndSize(this,b,&local_50,&local_58);
  local_40 = local_40 * local_58;
  local_48 = local_48 * local_50;
  bVar1 = b->nTime <= a->nTime;
  if (local_40 != local_48) {
    bVar1 = local_40 < local_48;
  }
  if (NAN(local_40) || NAN(local_48)) {
    bVar1 = local_40 < local_48;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const CTxMemPoolEntry& a, const CTxMemPoolEntry& b) const
    {
        double a_mod_fee, a_size, b_mod_fee, b_size;

        GetModFeeAndSize(a, a_mod_fee, a_size);
        GetModFeeAndSize(b, b_mod_fee, b_size);

        // Avoid division by rewriting (a/b > c/d) as (a*d > c*b).
        double f1 = a_mod_fee * b_size;
        double f2 = a_size * b_mod_fee;

        if (f1 == f2) {
            return a.GetTime() >= b.GetTime();
        }
        return f1 < f2;
    }